

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smyblas2.c
# Opt level: O2

void smatvec(int ldm,int nrow,int ncol,float *M,float *vec,float *Mxvec)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  long lVar9;
  ulong uVar10;
  float *pfVar11;
  float *pfVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  
  lVar9 = (long)ldm;
  uVar14 = 0;
  uVar16 = (ulong)(uint)nrow;
  if (nrow < 1) {
    uVar16 = uVar14;
  }
  pfVar11 = M;
  for (lVar13 = 0; lVar13 < ncol + -7; lVar13 = lVar13 + 8) {
    fVar1 = vec[lVar13];
    fVar2 = vec[lVar13 + 1];
    fVar3 = vec[lVar13 + 2];
    fVar4 = vec[lVar13 + 3];
    fVar5 = vec[lVar13 + 4];
    fVar6 = vec[lVar13 + 5];
    fVar7 = vec[lVar13 + 6];
    fVar8 = vec[lVar13 + 7];
    for (uVar15 = 0; uVar16 != uVar15; uVar15 = uVar15 + 1) {
      pfVar12 = pfVar11 + uVar15;
      Mxvec[uVar15] =
           pfVar12[lVar9 * 7] * fVar8 +
           pfVar12[lVar9 * 6] * fVar7 +
           pfVar12[lVar9 * 5] * fVar6 +
           pfVar12[lVar9 * 4] * fVar5 +
           pfVar12[lVar9 * 3] * fVar4 +
           pfVar12[lVar9 * 2] * fVar3 + *pfVar12 * fVar1 + pfVar12[lVar9] * fVar2 + Mxvec[uVar15];
    }
    pfVar11 = pfVar11 + ldm * 8;
    uVar14 = uVar14 + (long)(ldm * 8) * 4;
  }
  for (; lVar13 < ncol + -3; lVar13 = lVar13 + 4) {
    fVar1 = vec[lVar13];
    fVar2 = vec[lVar13 + 1];
    fVar3 = vec[lVar13 + 2];
    fVar4 = vec[lVar13 + 3];
    uVar15 = uVar14;
    uVar10 = uVar16;
    pfVar12 = Mxvec;
    while (bVar17 = uVar10 != 0, uVar10 = uVar10 - 1, bVar17) {
      *pfVar12 = *(float *)((long)M + uVar15 + lVar9 * 0xc) * fVar4 +
                 *(float *)((long)M + uVar15 + lVar9 * 8) * fVar3 +
                 *(float *)((long)M + uVar15) * fVar1 +
                 *(float *)((long)M + uVar15 + lVar9 * 4) * fVar2 + *pfVar12;
      pfVar12 = pfVar12 + 1;
      uVar15 = uVar15 + 4;
    }
    pfVar11 = pfVar11 + ldm * 4;
    uVar14 = uVar14 + (long)(ldm * 4) * 4;
  }
  for (; lVar13 < ncol; lVar13 = lVar13 + 1) {
    fVar1 = vec[lVar13];
    for (uVar14 = 0; uVar16 != uVar14; uVar14 = uVar14 + 1) {
      Mxvec[uVar14] = pfVar11[uVar14] * fVar1 + Mxvec[uVar14];
    }
    pfVar11 = pfVar11 + lVar9;
  }
  return;
}

Assistant:

void smatvec (int ldm, int nrow, int ncol, float *M, float *vec, float *Mxvec)
{
    float vi0, vi1, vi2, vi3, vi4, vi5, vi6, vi7;
    float *M0;
    register float *Mki0, *Mki1, *Mki2, *Mki3, *Mki4, *Mki5, *Mki6, *Mki7;
    register int firstcol = 0;
    int k;

    M0 = &M[0];
    while ( firstcol < ncol - 7 ) {	/* Do 8 columns */

	Mki0 = M0;
	Mki1 = Mki0 + ldm;
        Mki2 = Mki1 + ldm;
        Mki3 = Mki2 + ldm;
	Mki4 = Mki3 + ldm;
	Mki5 = Mki4 + ldm;
	Mki6 = Mki5 + ldm;
	Mki7 = Mki6 + ldm;

	vi0 = vec[firstcol++];
	vi1 = vec[firstcol++];
	vi2 = vec[firstcol++];
	vi3 = vec[firstcol++];	
	vi4 = vec[firstcol++];
	vi5 = vec[firstcol++];
	vi6 = vec[firstcol++];
	vi7 = vec[firstcol++];	

	for (k = 0; k < nrow; k++) 
	    Mxvec[k] += vi0 * *Mki0++ + vi1 * *Mki1++
		      + vi2 * *Mki2++ + vi3 * *Mki3++ 
		      + vi4 * *Mki4++ + vi5 * *Mki5++
		      + vi6 * *Mki6++ + vi7 * *Mki7++;

	M0 += 8 * ldm;
    }

    while ( firstcol < ncol - 3 ) {	/* Do 4 columns */

	Mki0 = M0;
	Mki1 = Mki0 + ldm;
	Mki2 = Mki1 + ldm;
	Mki3 = Mki2 + ldm;

	vi0 = vec[firstcol++];
	vi1 = vec[firstcol++];
	vi2 = vec[firstcol++];
	vi3 = vec[firstcol++];	
	for (k = 0; k < nrow; k++) 
	    Mxvec[k] += vi0 * *Mki0++ + vi1 * *Mki1++
		      + vi2 * *Mki2++ + vi3 * *Mki3++ ;

	M0 += 4 * ldm;
    }

    while ( firstcol < ncol ) {		/* Do 1 column */

 	Mki0 = M0;
	vi0 = vec[firstcol++];
	for (k = 0; k < nrow; k++)
	    Mxvec[k] += vi0 * *Mki0++;

	M0 += ldm;
    }
	
}